

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void xatlas::internal::TaskScheduler::workerThread
               (TaskScheduler *scheduler,Worker *worker,uint32_t threadIndex)

{
  __atomic_flag_data_type _Var1;
  uint uVar2;
  TaskGroup *pTVar3;
  uint8_t *puVar4;
  uint32_t *puVar5;
  ulong uVar6;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  puVar5 = (uint32_t *)__tls_get_addr(&PTR_00138fc0);
  *puVar5 = threadIndex;
  local_40._M_device = &worker->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
LAB_00116c5c:
  while (((worker->wakeup)._M_base._M_i & 1U) == 0) {
    std::condition_variable::wait((unique_lock *)&worker->cv);
  }
  LOCK();
  (worker->wakeup)._M_base._M_i = false;
  UNLOCK();
LAB_00116c75:
  if (((scheduler->m_shutdown)._M_base._M_i & 1U) != 0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    return;
  }
  if (scheduler->m_maxGroups != 0) {
    uVar6 = 0;
    do {
      pTVar3 = scheduler->m_groups;
      if (((pTVar3[uVar6].free._M_base._M_i & 1U) == 0) &&
         (pTVar3[uVar6].ref.super___atomic_base<unsigned_int>._M_i != 0)) {
        do {
          LOCK();
          _Var1 = pTVar3[uVar6].queueLock.m_lock.super___atomic_flag_base._M_i;
          pTVar3[uVar6].queueLock.m_lock.super___atomic_flag_base._M_i = true;
          UNLOCK();
        } while (_Var1 != false);
        uVar2 = pTVar3[uVar6].queueHead;
        if (uVar2 < pTVar3[uVar6].queue.m_base.size) goto LAB_00116cc9;
        pTVar3[uVar6].queueLock.m_lock.super___atomic_flag_base._M_i = false;
      }
      uVar6 = uVar6 + 1;
      if (scheduler->m_maxGroups <= uVar6) break;
    } while( true );
  }
  goto LAB_00116c5c;
LAB_00116cc9:
  pTVar3[uVar6].queueHead = uVar2 + 1;
  puVar4 = pTVar3[uVar6].queue.m_base.buffer;
  if (puVar4 == (uint8_t *)0x0) {
    __assert_fail("m_base.buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x480,
                  "T &xatlas::internal::Array<xatlas::internal::Task>::operator[](uint32_t) [T = xatlas::internal::Task]"
                 );
  }
  pTVar3[uVar6].queueLock.m_lock.super___atomic_flag_base._M_i = false;
  (**(code **)(puVar4 + (ulong)uVar2 * 0x10))
            (pTVar3[uVar6].userData,*(undefined8 *)(puVar4 + (ulong)uVar2 * 0x10 + 8));
  LOCK();
  pTVar3[uVar6].ref.super___atomic_base<unsigned_int>._M_i =
       pTVar3[uVar6].ref.super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  goto LAB_00116c75;
}

Assistant:

static void workerThread(TaskScheduler *scheduler, Worker *worker, uint32_t threadIndex)
	{
		m_threadIndex = threadIndex;
		std::unique_lock<std::mutex> lock(worker->mutex);
		for (;;) {
			worker->cv.wait(lock, [=]{ return worker->wakeup.load(); });
			worker->wakeup = false;
			for (;;) {
				if (scheduler->m_shutdown)
					return;
				// Look for a task in any of the groups and run it.
				TaskGroup *group = nullptr;
				Task *task = nullptr;
				for (uint32_t i = 0; i < scheduler->m_maxGroups; i++) {
					group = &scheduler->m_groups[i];
					if (group->free || group->ref == 0)
						continue;
					group->queueLock.lock();
					if (group->queueHead < group->queue.size()) {
						task = &group->queue[group->queueHead++];
						group->queueLock.unlock();
						break;
					}
					group->queueLock.unlock();
				}
				if (!task)
					break;
				task->func(group->userData, task->userData);
				group->ref--;
			}
		}
	}